

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  char *__path;
  int iVar1;
  int *piVar2;
  char **__envp;
  undefined8 *in_RDI;
  bool bVar3;
  char *original_dir;
  int gtest_retval;
  ExecDeathTestArgs *args;
  char *in_stack_fffffffffffffd00;
  char **__argv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_stack_fffffffffffffd10;
  string *message;
  int *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  undefined1 local_2b1 [33];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [39];
  undefined1 local_1c9 [33];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  char *local_148;
  undefined4 local_13c;
  string local_138 [55];
  allocator<char> local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [36];
  int local_1c;
  undefined8 *local_18;
  
  local_18 = in_RDI;
  do {
    do {
      local_1c = close(*(int *)(local_18 + 1));
      bVar3 = false;
      if (local_1c == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_1c == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                 (allocator<char> *)in_stack_fffffffffffffd30);
      std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      local_13c = 0x1d10;
      StreamableToString<int>(in_stack_fffffffffffffd28);
      std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      DeathTestAbort(in_stack_fffffffffffffd10);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator(&local_101);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  UnitTest::GetInstance();
  local_148 = UnitTest::original_working_dir((UnitTest *)0x14af93);
  iVar1 = chdir(local_148);
  if (iVar1 == 0) {
    __argv = (char **)*local_18;
    __path = *__argv;
    __envp = GetEnviron();
    execve(__path,__argv,__envp);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
               (allocator<char> *)in_stack_fffffffffffffd30);
    std::operator+(__lhs,(char *)__argv);
    std::operator+(__lhs,(char *)__argv);
    std::operator+(__lhs,(char *)__argv);
    std::operator+(__lhs,(char *)__argv);
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    DeathTestAbort(in_stack_fffffffffffffd10);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd28);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string(local_270);
    std::__cxx11::string::~string(local_290);
    std::__cxx11::string::~string((string *)(local_2b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2b1);
  }
  else {
    message = (string *)local_1c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
               (allocator<char> *)in_stack_fffffffffffffd30);
    std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    DeathTestAbort(message);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string((string *)(local_1c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1c9);
  }
  return 1;
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execve() as it's a direct system call.  We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execve() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execve(args->argv[0], args->argv, GetEnviron());
  DeathTestAbort(std::string("execve(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}